

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopup(char *str_id,ImGuiWindowFlags flags)

{
  ImGuiID id;
  char *unaff_retaddr;
  ImGuiContext *g;
  ImGuiID in_stack_00000010;
  bool local_1;
  
  if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(flags,in_stack_00000010),
                       (char *)CONCAT44(g._4_4_,g._0_4_),unaff_retaddr);
    local_1 = BeginPopupEx(in_stack_00000010,g._4_4_);
  }
  else {
    ImGuiNextWindowData::ClearFlags(&GImGui->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopup(const char* str_id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size <= g.BeginPopupStack.Size) // Early out for performance
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }
    flags |= ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings;
    ImGuiID id = g.CurrentWindow->GetID(str_id);
    return BeginPopupEx(id, flags);
}